

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void * bgui::anon_unknown_0::eventLoop(void *arg)

{
  int iVar1;
  bool bVar2;
  uint __i;
  int iVar3;
  long lVar4;
  ssize_t sVar5;
  XEvent *event_00;
  fd_set fds;
  XEvent event_1;
  XEvent event;
  
  iVar1 = *(int *)(*(long *)((long)arg + 8) + 0x10);
  do {
    iVar3 = XPending(*(undefined8 *)((long)arg + 8));
    if ((iVar3 == 0) && (iVar3 = *(int *)((long)arg + 0x50), iVar3 != 0)) {
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        fds.fds_bits[lVar4] = 0;
      }
      fds.fds_bits[iVar1 / 0x40] = fds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
      fds.fds_bits[iVar3 / 0x40] = fds.fds_bits[iVar3 / 0x40] | 1L << ((byte)iVar3 & 0x3f);
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
      select(iVar3 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      sVar5 = read(*(int *)((long)arg + 0x50),&event,0x400);
      for (iVar3 = 0; iVar3 < (int)sVar5;
          iVar3 = iVar3 + *(int *)((long)&event + (long)iVar3 + 0xc) + 0x10) {
        usleep(250000);
        (**(code **)(**arg + 0x30))(*arg,*(undefined4 *)((long)&event + (long)iVar3));
      }
      iVar3 = XPending(*(undefined8 *)((long)arg + 8));
      if (0 < iVar3) {
        event_00 = &event_1;
        XNextEvent(*(undefined8 *)((long)arg + 8),event_00);
        goto LAB_00128274;
      }
      bVar2 = true;
    }
    else {
      XNextEvent(*(undefined8 *)((long)arg + 8),&event);
      event_00 = &event;
LAB_00128274:
      bVar2 = handleX11Event((BaseWindowData *)arg,event_00);
    }
    if (bVar2 == false) {
      *(undefined1 *)((long)arg + 0xd0) = 0;
      XUnmapWindow(*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x18));
      XFlush(*(undefined8 *)((long)arg + 8));
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *eventLoop(void *arg)
{
  BaseWindowData *p=static_cast<BaseWindowData *>(arg);
  bool run=true;

#ifdef INCLUDE_INOTIFY
  int x11_fd=ConnectionNumber(p->display);
#endif

  while (run)
  {
#ifdef INCLUDE_INOTIFY

    if (XPending(p->display) == 0 && p->inotify_fd != 0)
    {
      // wait for X11 and inotify events at the same time

      fd_set fds;
      const int buflen=1024;
      char buffer[buflen];

      FD_ZERO(&fds);
      FD_SET(x11_fd, &fds);
      FD_SET(p->inotify_fd, &fds);

      select(std::max(x11_fd, p->inotify_fd)+1, &fds, 0, 0, 0);

      // handle inotify events

      int i=0, s=read(p->inotify_fd, buffer, buflen);

      while (i < s)
      {
        struct inotify_event *event=reinterpret_cast<struct inotify_event *>(buffer+i);

        usleep(250000);

        p->parent->onFileChanged(event->wd);

        i+=sizeof(struct inotify_event)+event->len;
      }

      // handle X11 events

      if (XPending(p->display) > 0)
      {
        XEvent event;

        XNextEvent(p->display, &event);
        run=handleX11Event(p, event);
      }
    }
    else
#endif
    {
      // wait for and handle X11 events only

      XEvent event;

      XNextEvent(p->display, &event);
      run=handleX11Event(p, event);
    }
  }

  p->running=false;

  XUnmapWindow(p->display, p->window);
  XFlush(p->display);

  return 0;
}